

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestServer.cpp
# Opt level: O2

void __thiscall testListenConnectReadWriteAndClose()::Handler::onConnected(Handler *this)

{
  Client *in_RSI;
  
  onConnected(Server::Client__(this + -8,in_RSI);
  return;
}

Assistant:

Server::Client::ICallback *onConnected(Server::Client &client) override
    {
      ASSERT(_state == connecting1 || _state == connecting2);
      _client1._client = &client;

      ASSERT(_client1._client->write(_testData, sizeof(_testData)));
      if (_state == connecting1)
        _state = connecting2;
      else
        _state = sending1;
      return &_client1;
    }